

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O3

bool __thiscall JsonModelSerialiser::saveModel(JsonModelSerialiser *this,QIODevice *destination)

{
  char cVar1;
  QString tempString;
  QTextStream writer;
  QString local_38;
  QTextStream local_20 [16];
  
  if (destination == (QIODevice *)0x0) {
    cVar1 = '\0';
  }
  else {
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char16_t *)0x0;
    local_38.d.size = 0;
    cVar1 = (**(code **)(*(long *)&(this->super_AbstractStringSerialiser).
                                   super_AbstractModelSerialiser + 0xc0))();
    if (cVar1 != '\0') {
      QTextStream::QTextStream(local_20,destination);
      QTextStream::operator<<(local_20,&local_38);
      QTextStream::~QTextStream(local_20);
    }
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,8);
      }
    }
  }
  return (bool)cVar1;
}

Assistant:

bool JsonModelSerialiser::saveModel(QIODevice *destination) const
{
    if (!destination)
        return false;
    QString tempString;
    if (!saveModel(&tempString))
        return false;
    QTextStream writer(destination);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    writer.setCodec(textCodec());
#endif
    writer << tempString;
    return true;
}